

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTestGenerator.cxx
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
cmTestGenerator::EvaluateCommandLineArguments
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,cmTestGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *argv,cmGeneratorExpression *ge,string *config)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long lVar3;
  string *psVar4;
  size_type __n;
  pointer pbVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  undefined1 local_a0 [16];
  undefined8 local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  pointer local_70;
  cmTestGenerator *local_68;
  string *local_60;
  string *local_58;
  size_type *local_50;
  size_type local_48;
  size_type local_40;
  undefined8 uStack_38;
  
  pbVar5 = (argv->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_70 = (argv->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar3 = (long)local_70 - (long)pbVar5;
  local_68 = this;
  local_60 = config;
  local_58 = (string *)ge;
  if (0x1f < lVar3 || lVar3 == 0) {
    if (pbVar5 == local_70) {
      pbVar5 = (pointer)0x0;
    }
    else {
      __n = (lVar3 - 0x20U >> 5) + 1;
      local_78 = __gnu_cxx::
                 new_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::allocate((new_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)__return_storage_ptr__,__n,(void *)0x0);
      (__return_storage_ptr__->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start = local_78;
      (__return_storage_ptr__->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = local_78 + __n;
      paVar2 = &local_78->field_2;
      do {
        paVar6 = paVar2;
        cmGeneratorExpression::Parse((cmGeneratorExpression *)local_a0,local_58);
        local_90 = 0;
        local_88._M_local_buf[0] = '\0';
        local_a0._8_8_ = &local_88;
        psVar4 = cmCompiledGeneratorExpression::Evaluate
                           ((cmCompiledGeneratorExpression *)local_a0._0_8_,local_68->LG,local_60,
                            false,(cmGeneratorTarget *)0x0,(cmGeneratorTarget *)0x0,
                            (cmGeneratorExpressionDAGChecker *)0x0,(string *)(local_a0 + 8));
        pcVar1 = (psVar4->_M_dataplus)._M_p;
        local_50 = &local_40;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,pcVar1,pcVar1 + psVar4->_M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._8_8_ != &local_88) {
          operator_delete((void *)local_a0._8_8_,
                          CONCAT71(local_88._M_allocated_capacity._1_7_,local_88._M_local_buf[0]) +
                          1);
        }
        std::
        unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
        ::~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                       *)local_a0);
        (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(paVar6 + -1))->
        _M_dataplus)._M_p = (pointer)paVar6;
        if (local_50 == &local_40) {
          paVar6->_M_allocated_capacity = local_40;
          *(undefined8 *)((long)paVar6 + 8) = uStack_38;
        }
        else {
          (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(paVar6 + -1))->
          _M_dataplus)._M_p = (pointer)local_50;
          paVar6->_M_allocated_capacity = local_40;
        }
        *(size_type *)((long)paVar6 + -8) = local_48;
        pbVar5 = pbVar5 + 1;
        paVar2 = paVar6 + 2;
      } while (pbVar5 != local_70);
      pbVar5 = (pointer)(paVar6 + 1);
    }
    (__return_storage_ptr__->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = pbVar5;
    return __return_storage_ptr__;
  }
  std::__throw_length_error("cannot create std::vector larger than max_size()");
}

Assistant:

std::vector<std::string> cmTestGenerator::EvaluateCommandLineArguments(
  const std::vector<std::string>& argv, cmGeneratorExpression& ge,
  const std::string& config) const
{
  // Evaluate executable name and arguments
  auto evaluatedRange =
    cmMakeRange(argv).transform([&](const std::string& arg) {
      return ge.Parse(arg)->Evaluate(this->LG, config);
    });

  return { evaluatedRange.begin(), evaluatedRange.end() };
}